

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O2

void __thiscall
SigHashType_SetFromSigHashFlag_Test::SigHashType_SetFromSigHashFlag_Test
          (SigHashType_SetFromSigHashFlag_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c5620;
  return;
}

Assistant:

TEST(SigHashType, SetFromSigHashFlag) {
  SigHashType type;
  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x82));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashNone);
  EXPECT_TRUE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x41));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashAll);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_TRUE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x03));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashSingle);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());
}